

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O0

uint Ivy_NodeGetTruth_rec(Ivy_Obj_t *pObj,int *pNums,int nNums)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  int local_30;
  uint local_2c;
  int i;
  uint uTruth1;
  uint uTruth0;
  int nNums_local;
  int *pNums_local;
  Ivy_Obj_t *pObj_local;
  
  for (local_30 = 0; local_30 < nNums; local_30 = local_30 + 1) {
    if (pObj->Id == pNums[local_30]) {
      return Ivy_NodeGetTruth_rec::uMasks[local_30];
    }
  }
  iVar1 = Ivy_ObjIsNode(pObj);
  if ((iVar1 == 0) && (iVar1 = Ivy_ObjIsBuf(pObj), iVar1 == 0)) {
    __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyRwr.c"
                  ,0x140,"unsigned int Ivy_NodeGetTruth_rec(Ivy_Obj_t *, int *, int)");
  }
  pIVar2 = Ivy_ObjFanin0(pObj);
  i = Ivy_NodeGetTruth_rec(pIVar2,pNums,nNums);
  iVar1 = Ivy_ObjFaninC0(pObj);
  if (iVar1 != 0) {
    i = i ^ 0xffffffff;
  }
  iVar1 = Ivy_ObjIsBuf(pObj);
  if (iVar1 == 0) {
    pIVar2 = Ivy_ObjFanin1(pObj);
    local_2c = Ivy_NodeGetTruth_rec(pIVar2,pNums,nNums);
    iVar1 = Ivy_ObjFaninC1(pObj);
    if (iVar1 != 0) {
      local_2c = local_2c ^ 0xffffffff;
    }
    pObj_local._4_4_ = i & local_2c;
  }
  else {
    pObj_local._4_4_ = i;
  }
  return pObj_local._4_4_;
}

Assistant:

unsigned Ivy_NodeGetTruth_rec( Ivy_Obj_t * pObj, int * pNums, int nNums )
{
    static unsigned uMasks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth0, uTruth1;
    int i;
    for ( i = 0; i < nNums; i++ )
        if ( pObj->Id == pNums[i] )
            return uMasks[i];
    assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj) );
    uTruth0 = Ivy_NodeGetTruth_rec( Ivy_ObjFanin0(pObj), pNums, nNums );
    if ( Ivy_ObjFaninC0(pObj) )
        uTruth0 = ~uTruth0;
    if ( Ivy_ObjIsBuf(pObj) )
        return uTruth0;
    uTruth1 = Ivy_NodeGetTruth_rec( Ivy_ObjFanin1(pObj), pNums, nNums );
    if ( Ivy_ObjFaninC1(pObj) )
        uTruth1 = ~uTruth1;
    return uTruth0 & uTruth1;
}